

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TSS_Create(TSS_DEVICE *tpm,TSS_SESSION *sess,TPM_HANDLE parent,
                 TPM2B_SENSITIVE_CREATE *sensCreate,TPM2B_PUBLIC *inPub,TPM2B_PRIVATE *outPriv,
                 TPM2B_PUBLIC *outPub)

{
  TPM_RC TVar1;
  TPM2B_SENSITIVE_CREATE *local_188;
  undefined1 local_16c [8];
  TPML_PCR_SELECTION creationPCR;
  TPM2B_DATA outsideInfo;
  TPM2B_SENSITIVE_CREATE locSensCreate;
  TPM2B_PRIVATE *outPriv_local;
  TPM2B_PUBLIC *inPub_local;
  TPM2B_SENSITIVE_CREATE *sensCreate_local;
  TPM_HANDLE parent_local;
  TSS_SESSION *sess_local;
  TSS_DEVICE *tpm_local;
  
  locSensCreate.sensitive.data._126_8_ = outPriv;
  memset(outsideInfo.t.buffer + 0x3a,0,0xca);
  memset(creationPCR.pcrSelections + 3,0,0x44);
  memset(local_16c,0,0x1c);
  local_188 = sensCreate;
  if (sensCreate == (TPM2B_SENSITIVE_CREATE *)0x0) {
    local_188 = (TPM2B_SENSITIVE_CREATE *)(outsideInfo.t.buffer + 0x3a);
  }
  TVar1 = TPM2_Create(tpm,sess,parent,local_188,inPub,(TPM2B_DATA *)(creationPCR.pcrSelections + 3),
                      (TPML_PCR_SELECTION *)local_16c,
                      (TPM2B_PRIVATE *)locSensCreate.sensitive.data._126_8_,outPub,
                      (TPM2B_CREATION_DATA *)0x0,(TPM2B_DIGEST *)0x0,(TPMT_TK_CREATION *)0x0);
  return TVar1;
}

Assistant:

TPM_RC TSS_Create(TSS_DEVICE *tpm, TSS_SESSION* sess, TPM_HANDLE parent, TPM2B_SENSITIVE_CREATE *sensCreate,
    TPM2B_PUBLIC *inPub, TPM2B_PRIVATE *outPriv, TPM2B_PUBLIC *outPub)
{
    TPM2B_SENSITIVE_CREATE  locSensCreate = { 0 };
    TPM2B_DATA              outsideInfo = { {0} };
    TPML_PCR_SELECTION      creationPCR = { 0 };

    return TPM2_Create(tpm, sess, parent,
        sensCreate ? sensCreate : &locSensCreate,
        inPub, &outsideInfo, &creationPCR,
        outPriv, outPub, NULL, NULL, NULL);
}